

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O1

value value_alloc(size_t bytes)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)malloc(bytes + 0x28);
  if (puVar1 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    *puVar1 = "value_impl_magic_alloc";
    puVar1[1] = bytes;
    puVar1[2] = 1;
    puVar2 = puVar1 + 5;
    puVar1[3] = 0;
    puVar1[4] = 0;
  }
  return puVar2;
}

Assistant:

value value_alloc(size_t bytes)
{
	value_impl impl = malloc(sizeof(struct value_impl_type) + bytes);

	if (impl == NULL)
	{
		return NULL;
	}

	impl->magic = (uintptr_t)value_impl_magic_alloc;
	impl->bytes = bytes;
	impl->ref_count = 1;
	impl->finalizer = NULL;
	impl->finalizer_data = NULL;

	return (value)(((uintptr_t)impl) + sizeof(struct value_impl_type));
}